

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wxcli.hpp
# Opt level: O2

string * __thiscall
ws::Cli::get_media_id(string *__return_storage_ptr__,Cli *this,string *path,bool no_retry)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  Error error;
  string *this_00;
  initializer_list<httplib::MultipartFormData> __l;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  allocator_type local_949;
  undefined1 local_948 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_920;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  json;
  Headers headers;
  Result res;
  string local_880;
  string local_860 [32];
  MultipartFormDataItems items;
  _Any_data local_828;
  undefined8 local_818;
  undefined8 uStack_810;
  string local_800;
  ifstream file;
  ulong local_7d8;
  streambuf local_7d0 [16];
  int aiStack_7c0 [122];
  SSLClient cli;
  stringstream file_ss;
  undefined1 local_1a8 [376];
  
  if ((this->access_token)._M_string_length == 0) {
    get_access_token(this);
  }
  std::ifstream::ifstream(&file,(string *)path,_S_bin);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)&cli,path,auto_format);
  bVar1 = std::filesystem::exists((path *)&cli);
  if (bVar1) {
    iVar2 = *(int *)((long)aiStack_7c0 + *(long *)(_file + -0x18));
    std::filesystem::__cxx11::path::~path((path *)&cli);
    if (iVar2 == 0) goto LAB_0012a919;
  }
  else {
    std::filesystem::__cxx11::path::~path((path *)&cli);
  }
  std::__cxx11::string::string
            ((string *)&cli,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)no_fmt_abi_cxx11_)
  ;
  cli.super_ClientImpl.host_.field_2._8_8_ = &PTR_s__workspace_llm4binary_github_lic_00195820;
  critical<char_const(&)[14]>((FormatWithLoc *)&cli,(char (*) [14])"No such file.");
  std::__cxx11::string::~string((string *)&cli);
LAB_0012a919:
  std::istream::ignore((long)&file);
  std::ios::clear((int)&file + (int)*(undefined8 *)(_file + -0x18));
  std::istream::seekg(&file,0,0);
  if (0x1400000 < local_7d8) {
    std::__cxx11::string::string
              ((string *)&cli,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               no_fmt_abi_cxx11_);
    cli.super_ClientImpl.host_.field_2._8_8_ = &PTR_s__workspace_llm4binary_github_lic_00195838;
    critical<char_const(&)[21]>((FormatWithLoc *)&cli,(char (*) [21])"The file is too big.");
    std::__cxx11::string::~string((string *)&cli);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&file_ss);
  std::ostream::operator<<(local_1a8,local_7d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"qyapi.weixin.qq.com",(allocator<char> *)&headers);
  httplib::SSLClient::SSLClient(&cli,(string *)&res);
  std::__cxx11::string::~string((string *)&res);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"media",(allocator<char> *)&local_920);
  std::__cxx11::stringbuf::str();
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            ((path *)local_948,path,auto_format);
  std::filesystem::__cxx11::path::filename((path *)&headers,(path *)local_948);
  std::filesystem::__cxx11::path::string(&local_880,(path *)&headers);
  std::__cxx11::string::string<std::allocator<char>>
            (local_860,"application/octet-stream",(allocator<char> *)&json);
  __l._M_len = 1;
  __l._M_array = (iterator)&res;
  std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::vector
            (&items,__l,&local_949);
  httplib::MultipartFormData::~MultipartFormData((MultipartFormData *)&res);
  std::filesystem::__cxx11::path::~path((path *)&headers);
  std::filesystem::__cxx11::path::~path((path *)local_948);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_const_char_(&)[20],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&res,(char (*) [13])"Content-Type",(char (*) [20])"multipart/form-data");
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&res;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap(&headers,__l_00,(ci *)local_948,(allocator_type *)&local_920);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&res);
  std::operator+(&local_920,"/cgi-bin/media/upload?access_token=",&this->access_token);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_948,
                 &local_920,"&type=file");
  httplib::ClientImpl::Post(&res,&cli.super_ClientImpl,(string *)local_948,&headers,&items);
  std::__cxx11::string::~string((string *)local_948);
  std::__cxx11::string::~string((string *)&local_920);
  if (((__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)
       res.res_._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl ==
       (__uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>)0x0) ||
     (*(int *)((long)res.res_._M_t.
                     super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                     .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x20) != 200)
     ) {
    std::__cxx11::string::string
              ((string *)local_948,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               no_fmt_abi_cxx11_);
    local_948._32_8_ = &PTR_s__workspace_llm4binary_github_lic_00195850;
    httplib::to_string_abi_cxx11_(&local_920,(httplib *)(ulong)res.err_,error);
    critical<char_const(&)[25],char_const(&)[8],std::__cxx11::string>
              ((FormatWithLoc *)local_948,(char (*) [25])"Get access token failed.",
               (char (*) [8])"Error: ",&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::string::~string((string *)local_948);
  }
  local_828._M_unused._M_object = (void *)0x0;
  local_828._8_8_ = 0;
  local_818 = 0;
  uStack_810 = 0;
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&json,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      ((long)res.res_._M_t.
                             super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                             .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78)
             ,(parser_callback_t *)&local_828,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_828);
  pvVar3 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&json,"errcode");
  iVar2 = nlohmann::json_abi_v3_11_2::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::get_impl<int,_0>(pvVar3);
  if (iVar2 != 0) {
    if ((((iVar2 != 0x9c4e) && (iVar2 != 0xa411)) && (iVar2 != 0xa029)) || (no_retry)) {
      std::__cxx11::string::string
                ((string *)local_948,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 no_fmt_abi_cxx11_);
      local_948._32_8_ = &PTR_s__workspace_llm4binary_github_lic_00195868;
      std::__cxx11::to_string(&local_920,iVar2);
      critical<char_const(&)[21],char_const(&)[10],std::__cxx11::string,char_const(&)[7],std::__cxx11::string&,char_const(&)[8],std::__cxx11::string_const&>
                ((FormatWithLoc *)local_948,(char (*) [21])"Get media id failed.",
                 (char (*) [10])0x1637e5,&local_920,(char (*) [7])",res: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)res.res_._M_t.
                        super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>
                        .super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl + 0x78),
                 (char (*) [8])",path: ",path);
      std::__cxx11::string::~string((string *)&local_920);
      this_00 = (string *)local_948;
    }
    else {
      get_access_token(this);
      get_media_id(&local_800,this,path,true);
      this_00 = &local_800;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  pvVar3 = nlohmann::json_abi_v3_11_2::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&json,"media_id");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,pvVar3);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json(&json);
  httplib::Result::~Result(&res);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&headers._M_t);
  std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::~vector
            (&items);
  httplib::SSLClient::~SSLClient(&cli);
  std::__cxx11::stringstream::~stringstream((stringstream *)&file_ss);
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

std::string get_media_id(const std::string &path, bool no_retry = false)
    {
      if (access_token.empty()) get_access_token();
      std::ifstream file{path, std::ios::binary};
      if (!std::filesystem::exists(path) || !file.good())
      {
        critical(no_fmt, "No such file.");
      }
    
      file.ignore((std::numeric_limits<std::streamsize>::max)());
      size_t file_size = file.gcount();
      file.clear();
      file.seekg(std::ios_base::beg);
      if (file_size > 20 * 1024 * 1024)
      {
        critical(no_fmt, "The file is too big.");
      }
      
      std::stringstream file_ss;
      file_ss << file.rdbuf();
      
      httplib::SSLClient cli("qyapi.weixin.qq.com");
      httplib::MultipartFormDataItems items
          {
              httplib::MultipartFormData
                  {"media", file_ss.str(), std::filesystem::path(path).filename().string(), "application/octet-stream"}
          };
      httplib::Headers headers
          {
              {"Content-Type", "multipart/form-data"}
          };
      auto res = cli.Post("/cgi-bin/media/upload?access_token=" + access_token + "&type=file", headers, items);
      if (res == nullptr || res->status != 200)
      {
        critical(no_fmt, "Get access token failed.", "Error: ", httplib::to_string(res.error()));
      }
      
      auto json = nlohmann::json::parse(res->body);
      if (auto errcode = json["errcode"].get<int>(); errcode != 0)
      {
        if ((errcode == 41001 || errcode == 42001 || errcode == 40014) && !no_retry)
        {
          get_access_token();
          get_media_id(path, true);
        }
        else
        {
          critical(no_fmt,
                   "Get media id failed.",
                   "errcode: ", std::to_string(errcode), ",res: ", res->body, ",path: ", path);
        }
      }
      return json["media_id"].get<std::string>();
    }